

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadMemidx(BinaryReader *this,Index *memidx,char *desc)

{
  uint uVar1;
  bool bVar2;
  Result result;
  size_type_conflict sVar3;
  char *desc_local;
  Index *memidx_local;
  BinaryReader *this_local;
  
  result = ReadIndex(this,memidx,desc);
  bVar2 = Failed(result);
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    uVar1 = *memidx;
    sVar3 = std::vector<wabt::Limits,_std::allocator<wabt::Limits>_>::size(&this->memories);
    if (uVar1 < sVar3) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    else {
      PrintError(this,"memory index %u out of range",(ulong)*memidx);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadMemidx(Index* memidx, const char* desc) {
  CHECK_RESULT(ReadIndex(memidx, desc));
  ERROR_UNLESS(*memidx < memories.size(), "memory index %u out of range",
               *memidx);
  return Result::Ok;
}